

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int base64_decode(char *in_buf,uint in_size,void *out_buf,uint out_size,BASE64_OPTIONS *options)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint in_ECX;
  ulong uVar4;
  uint uVar5;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  BASE64_OPTIONS *in_R8;
  uint v;
  uint out_off;
  uint in_off;
  uint out_size_needed;
  uint8_t *out;
  char *in;
  int i;
  uint8_t table [256];
  uint local_15c;
  uint local_158;
  uint local_154;
  int local_13c;
  byte local_138 [264];
  BASE64_OPTIONS *local_30;
  uint local_24;
  long local_20;
  uint local_14;
  uint local_4;
  
  local_15c = 0;
  local_30 = in_R8;
  if (in_R8 == (BASE64_OPTIONS *)0x0) {
    local_30 = &base64_def_options;
  }
  local_14 = in_ESI;
  if (((local_30->pad != '\0') && (in_ESI != 0)) && ((in_ESI & 3) == 0)) {
    if (*(char *)(in_RDI + (ulong)(in_ESI - 1)) == local_30->pad) {
      local_14 = in_ESI - 1;
    }
    if (*(char *)(in_RDI + (ulong)(local_14 - 1)) == local_30->pad) {
      local_14 = local_14 - 1;
    }
  }
  local_24 = in_ECX;
  local_20 = in_RDX;
  memset(local_138,0xff,0x100);
  for (local_13c = 0; local_13c < 0x3e; local_13c = local_13c + 1) {
    local_138[(int)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"[local_13c]] =
         (byte)local_13c;
  }
  local_138[(int)local_30->ch62] = 0x3e;
  local_138[(int)local_30->ch63] = 0x3f;
  for (local_158 = 0; local_158 < local_14; local_158 = local_158 + 1) {
    if (local_138[(int)*(char *)(in_RDI + (ulong)local_158)] == 0xff) {
      return -0x16;
    }
  }
  local_154 = (local_14 >> 2) * 3;
  switch(local_14 & 3) {
  case 0:
    break;
  case 1:
    return -0x16;
  case 2:
    if ((local_138[(int)*(char *)(in_RDI + (ulong)(local_14 - 1))] & 0x4f) != 0) {
      return -0x16;
    }
    local_154 = local_154 + 1;
    break;
  case 3:
    if ((local_138[(int)*(char *)(in_RDI + (ulong)(local_14 - 1))] & 0xc3) != 0) {
      return -0x16;
    }
    local_154 = local_154 + 2;
  }
  if (local_20 == 0) {
    local_4 = local_154;
  }
  else if (local_24 < local_154) {
    local_4 = 0xffffff97;
  }
  else {
    local_158 = 0;
    while (local_158 + 4 <= local_14) {
      uVar4 = (ulong)local_158;
      bVar1 = local_138[(int)*(char *)(in_RDI + (ulong)(local_158 + 1))];
      uVar5 = local_158 + 3;
      bVar2 = local_138[(int)*(char *)(in_RDI + (ulong)(local_158 + 2))];
      local_158 = local_158 + 4;
      bVar3 = local_138[(int)*(char *)(in_RDI + (ulong)uVar5)];
      *(byte *)(in_RDX + (ulong)local_15c) =
           (byte)(((uint)bVar1 << 0xc) >> 0x10) |
           (byte)(((uint)local_138[(int)*(char *)(in_RDI + uVar4)] << 0x12) >> 0x10);
      uVar5 = local_15c + 2;
      *(byte *)(in_RDX + (ulong)(local_15c + 1)) =
           (byte)(((uint)bVar2 << 6) >> 8) | (byte)(((uint)bVar1 << 0xc) >> 8);
      local_15c = local_15c + 3;
      *(byte *)(in_RDX + (ulong)uVar5) = bVar3 | (byte)((uint)bVar2 << 6);
    }
    if (local_158 + 2 == local_14) {
      *(byte *)(in_RDX + (ulong)local_15c) =
           (byte)(((uint)local_138[(int)*(char *)(in_RDI + (ulong)(local_158 + 1))] << 0xc) >> 0x10)
           | (byte)(((uint)local_138[(int)*(char *)(in_RDI + (ulong)local_158)] << 0x12) >> 0x10);
      local_15c = local_15c + 1;
    }
    else if (local_158 + 3 == local_14) {
      bVar1 = local_138[(int)*(char *)(in_RDI + (ulong)(local_158 + 1))];
      bVar2 = local_138[(int)*(char *)(in_RDI + (ulong)(local_158 + 2))];
      uVar5 = local_15c + 1;
      *(byte *)(in_RDX + (ulong)local_15c) =
           (byte)(((uint)bVar1 << 0xc) >> 0x10) |
           (byte)(((uint)local_138[(int)*(char *)(in_RDI + (ulong)local_158)] << 0x12) >> 0x10);
      local_15c = local_15c + 2;
      *(byte *)(in_RDX + (ulong)uVar5) =
           (byte)(((uint)bVar2 << 6) >> 8) | (byte)(((uint)bVar1 << 0xc) >> 8);
    }
    local_4 = local_15c;
  }
  return local_4;
}

Assistant:

int
base64_decode(const char* in_buf, unsigned in_size,
              void* out_buf, unsigned out_size,
              const BASE64_OPTIONS* options)
{
    uint8_t table[256];
    int i;
    const char* in = in_buf;
    uint8_t* out = (uint8_t*) out_buf;
    unsigned out_size_needed;
    unsigned in_off = 0;
    unsigned out_off = 0;
    unsigned v;

    if(options == NULL)
        options = &base64_def_options;

    /* Ignore any padding. */
    if(options->pad != '\0'  &&  in_size > 0  &&  in_size % 4 == 0) {
        /* Valid Base64 can have up to two characters of padding. */
        if(in_buf[in_size - 1] == options->pad)
            in_size--;
        if(in_buf[in_size - 1] == options->pad)
            in_size--;
    }

    /* Build table. */
    memset(table, 0xff, 256);
    for(i = 0; i < 62; i++)
        table[(int) base64_table_core[i]] = i;
    table[(int) options->ch62] = 62;
    table[(int) options->ch63] = 63;

    /* Validate the input. */
    for(in_off = 0; in_off < in_size; in_off++) {
        if(table[(int) in[in_off]] == 0xff)
            return -EINVAL;
    }

    /* Every four characters are decoded into 3 bytes of output.
     * Note that on the end only certain values may appear from encoding
     * a tail of one or two bytes in base64_encode(). */
    out_size_needed = (in_size / 4) * 3;
    switch(in_size % 4) {
        case 0:
            break;
        case 1:
            return -EINVAL;
            break;

        case 2:
            if(table[(int) in[in_size-1]] & 0x4f)
                return -EINVAL;
            out_size_needed += 1;
            break;

        case 3:
            if(table[(int) in[in_size-1]] & 0xc3)
                return -EINVAL;
            out_size_needed += 2;
            break;
    }

    if(out_buf == NULL)
        return out_size_needed;

    /* Check we have enough space in the output. */
    if(out_size < out_size_needed)
        return -ENOBUFS;

    /* Main loop. */
    in_off = 0;
    while(in_off + 4 <= in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        v |= (unsigned)table[(int) in[in_off++]] << 6;
        v |= (unsigned)table[(int) in[in_off++]];

        out[out_off++] = (v >> 16) & 0xff;
        out[out_off++] = (v >>  8) & 0xff;
        out[out_off++] = (v      ) & 0xff;
    }

    if(in_off + 2 == in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        out[out_off++] = (v >> 16) & 0xff;
    } else if(in_off + 3 == in_size) {
        v  = (unsigned)table[(int) in[in_off++]] << 18;
        v |= (unsigned)table[(int) in[in_off++]] << 12;
        v |= (unsigned)table[(int) in[in_off++]] << 6;
        out[out_off++] = (v >> 16) & 0xff;
        out[out_off++] = (v >>  8) & 0xff;
    }

    return out_off;
}